

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

vector<lest::test,_std::allocator<lest::test>_> * __thiscall
lest::make<std::vector<lest::test,std::allocator<lest::test>>,lest::test>
          (vector<lest::test,_std::allocator<lest::test>_> *__return_storage_ptr__,lest *this,
          test *first,test *last)

{
  vector<lest::test,_std::allocator<lest::test>_> result;
  vector<lest::test,_std::allocator<lest::test>_> local_38;
  
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((test *)this != first) {
    do {
      std::vector<lest::test,_std::allocator<lest::test>_>::push_back(&local_38,(value_type *)this);
      this = (lest *)((long)this + 0x28);
    } while ((test *)this != first);
  }
  std::vector<lest::test,_std::allocator<lest::test>_>::vector(__return_storage_ptr__,&local_38);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  return __return_storage_ptr__;
}

Assistant:

C make( T const * first, T const * const last )
{
    C result;
    for ( ; first != last; ++first )
    {
       result.push_back( *first );
    }
    return result;
}